

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O0

void lts2::WaveletTransform(Mat *X,int Jmin,string *wavelet,uint options)

{
  bool bVar1;
  double dVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_98;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_90;
  const_iterator it_j;
  int local_64;
  undefined1 local_60 [4];
  int j;
  vector<int,_std::allocator<int>_> Jlist;
  int Jmax;
  int m;
  int n;
  bool isTranslationInvariant;
  bool isReverse;
  float h [5];
  uint options_local;
  string *wavelet_local;
  int Jmin_local;
  Mat *X_local;
  
  Jlist.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 2;
  dVar2 = log2((double)*(int *)(X + 8));
  dVar2 = floor(dVar2);
  Jlist.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = (int)dVar2 + -1;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_60);
  for (local_64 = (int)Jlist.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage; Jmin < local_64;
      local_64 = local_64 + -1) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_60,&local_64);
  }
  local_98._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_60);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_90,
             &local_98);
  while( true ) {
    local_a0._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_60);
    bVar1 = __gnu_cxx::operator!=(&local_90,&local_a0);
    if (!bVar1) break;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_90);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_60);
  return;
}

Assistant:

void lts2::WaveletTransform(cv::Mat const &X, int Jmin, std::string const &wavelet, unsigned int options)
{
  float const h[] = {1.586134342, -.05298011854, -.8829110762, .4435068522, 1.149604398};
  bool isReverse = false;
  bool isTranslationInvariant = false;
    
  //---------------- Handle separable wavelet transform here ----------------
    
  //---------------- Non-separable case ----------------
    
  int n = X.rows;
  int m = (sizeof(h)/sizeof(float) - 1)/2;
  int Jmax = (int)floor(log2(n)) - 1;

  std::vector<int> Jlist;
  int j = Jmax;
  while (j > Jmin) 
  {
    Jlist.push_back(j);
    --j;
  }
  if (isReverse)
  {
    std::reverse(Jlist.begin(), Jlist.end());
  }
    
  if (isTranslationInvariant == false)
  {
    std::vector<int>::const_iterator it_j = Jlist.begin();
    for ( ; it_j != Jlist.end(); ++it_j)
    {
      // Horizontal lifting step
      // Vertical lifting step
    }
  }
  else
  {
        
  }
}